

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(int argc,char **argv)

{
  int32 threshold;
  cmd_ln_t *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *mdeffile;
  char *countfn;
  char *pcVar4;
  char *mdeffile_00;
  long ln;
  char **ppcVar5;
  int32 cilistsize;
  hashelement_t **CDhash;
  char **CIlist;
  int32 cdheapsize;
  dicthashelement_t **dicthash;
  int32 ncd;
  phnhashelement_t **CIhash;
  heapelement_t **CDheap;
  int32 local_a4;
  hashelement_t **local_a0;
  char **local_98;
  int32 local_8c;
  dicthashelement_t **local_88;
  int32 local_7c;
  long local_78;
  char *local_70;
  char *local_68;
  char **local_60;
  phnhashelement_t **local_58;
  heapelement_t **local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  
  local_50 = (heapelement_t **)0x0;
  local_a0 = (hashelement_t **)0x0;
  local_58 = (phnhashelement_t **)0x0;
  local_88 = (dicthashelement_t **)0x0;
  local_a4 = 0;
  local_8c = 0;
  local_98 = (char **)0x0;
  parse_cmd_ln(argc,argv);
  pcVar1 = cmd_ln_get();
  pcVar2 = cmd_ln_str_r(pcVar1,"-ocimdef");
  pcVar1 = cmd_ln_get();
  pcVar3 = cmd_ln_str_r(pcVar1,"-oalltphnmdef");
  pcVar1 = cmd_ln_get();
  mdeffile = cmd_ln_str_r(pcVar1,"-ountiedmdef");
  pcVar1 = cmd_ln_get();
  countfn = cmd_ln_str_r(pcVar1,"-ocountfn");
  pcVar1 = cmd_ln_get();
  local_78 = cmd_ln_int_r(pcVar1,"-ignorewpos");
  if (pcVar2 != (char *)0x0) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/main.c"
            ,0x5c,"Will write CI mdef file %s\n");
  }
  if (pcVar3 != (char *)0x0) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/main.c"
            ,0x5e,"Will write alltriphone mdef file %s\n");
  }
  if (mdeffile != (char *)0x0) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/main.c"
            ,0x5f,"Will write untied mdef file %s\n");
  }
  if (countfn == (char *)0x0) {
    if ((pcVar2 == (char *)0x0 && pcVar3 == (char *)0x0) && mdeffile == (char *)0x0) {
      pcVar2 = "No output mdef files or count files specified!\n";
      ln = 99;
      goto LAB_00103259;
    }
  }
  else {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/main.c"
            ,0x60,"Will write triphone counts file %s\n");
  }
  pcVar1 = cmd_ln_get();
  pcVar4 = cmd_ln_str_r(pcVar1,"-dictfn");
  pcVar1 = cmd_ln_get();
  local_48 = cmd_ln_str_r(pcVar1,"-fdictfn");
  pcVar1 = cmd_ln_get();
  local_38 = cmd_ln_str_r(pcVar1,"-lsnfn");
  if (mdeffile == (char *)0x0 && countfn == (char *)0x0) {
LAB_00102ef3:
    mdeffile = (char *)0x0;
    countfn = (char *)0x0;
  }
  else if (local_38 == (char *)0x0 || pcVar4 == (char *)0x0) {
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/main.c"
            ,0x69,"Either dictionary or transcript file not given!\n");
    if (mdeffile != (char *)0x0) {
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/main.c"
              ,0x6a,"Untied mdef will not be made\n");
    }
    if (countfn != (char *)0x0) {
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/main.c"
              ,0x6b,"Phone counts will not be generated\n");
    }
    goto LAB_00102ef3;
  }
  local_70 = pcVar2;
  local_68 = pcVar3;
  local_60 = argv;
  local_40 = pcVar4;
  pcVar1 = cmd_ln_get();
  pcVar2 = cmd_ln_str_r(pcVar1,"-phnlstfn");
  pcVar1 = cmd_ln_get();
  pcVar3 = cmd_ln_str_r(pcVar1,"-triphnlstfn");
  pcVar1 = cmd_ln_get();
  pcVar4 = cmd_ln_str_r(pcVar1,"-inCImdef");
  pcVar1 = cmd_ln_get();
  mdeffile_00 = cmd_ln_str_r(pcVar1,"-inCDmdef");
  if (((mdeffile_00 == (char *)0x0 && pcVar4 == (char *)0x0) && pcVar2 == (char *)0x0) &&
      pcVar3 == (char *)0x0) {
    pcVar2 = "No input mdefs or phone list given\n";
    ln = 0x74;
LAB_00103259:
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/main.c"
            ,ln,pcVar2);
    exit(1);
  }
  if (pcVar3 != (char *)0x0) {
    if (pcVar2 != (char *)0x0) {
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/main.c"
              ,0x77,"Both -triphnlist %s and -phnlist given.\n",pcVar3);
    }
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/main.c"
            ,0x78,"Ignoring -phnlist %s\n");
    pcVar2 = pcVar3;
  }
  if (mdeffile_00 == (char *)0x0) {
    if (pcVar2 != (char *)0x0) {
      make_ci_list_cd_hash_frm_phnlist(pcVar2,&local_98,&local_a4,&local_a0,&local_7c);
    }
    pcVar2 = local_68;
    if (pcVar4 != (char *)0x0) {
      if (local_98 != (char **)0x0) {
        ckd_free_2d(local_98);
      }
      make_ci_list_frm_mdef(pcVar4,&local_98,&local_a4);
    }
    ppcVar5 = local_60;
    if (local_70 == (char *)0x0) {
      if (pcVar3 == (char *)0x0 && mdeffile_00 == (char *)0x0) {
        read_dict(local_40,local_48,&local_88);
        if (local_a0 != (hashelement_t **)0x0) {
          freehash(local_a0);
        }
        make_dict_triphone_list(local_88,&local_a0,(int)local_78);
      }
      goto LAB_0010311a;
    }
  }
  else {
    if (pcVar4 != (char *)0x0 || pcVar2 != (char *)0x0) {
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/main.c"
              ,0x7f,"Using only input CD mdef %s!\n",mdeffile_00);
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/main.c"
              ,0x80,"Using only triphones from input CD mdef %s!\n",mdeffile_00);
      if (pcVar4 != (char *)0x0) {
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/main.c"
                ,0x81,"CImdef %s will be ignored\n",pcVar4);
      }
      if (pcVar2 != (char *)0x0) {
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/main.c"
                ,0x82,"phonelist %s will be ignored\n",pcVar2);
      }
    }
    make_ci_list_cd_hash_frm_mdef(mdeffile_00,&local_98,&local_a4,&local_a0,&local_7c);
    pcVar2 = local_68;
    ppcVar5 = local_60;
    if (local_70 == (char *)0x0) goto LAB_0010311a;
  }
  ppcVar5 = local_60;
  make_mdef_from_list(local_70,local_98,local_a4,(heapelement_t **)0x0,0,*local_60);
LAB_0010311a:
  if (pcVar2 != (char *)0x0) {
    make_CD_heap(local_a0,-1,&local_50,&local_8c);
    make_mdef_from_list(pcVar2,local_98,local_a4,local_50,local_8c,*ppcVar5);
  }
  if (countfn != (char *)0x0 || mdeffile != (char *)0x0) {
    count_triphones(local_38,local_88,local_a0,&local_58,(int)local_78);
    if (countfn != (char *)0x0) {
      print_counts(countfn,local_58,local_a0);
    }
    if (mdeffile != (char *)0x0) {
      threshold = find_threshold(local_a0);
      make_CD_heap(local_a0,threshold,&local_50,&local_8c);
      make_mdef_from_list(mdeffile,local_98,local_a4,local_50,local_8c,*ppcVar5);
    }
  }
  return 0;
}

Assistant:

int main (int argc, char **argv)
{
    heapelement_t **CDheap=NULL;
    hashelement_t **CDhash=NULL;
    phnhashelement_t **CIhash=NULL;
    dicthashelement_t **dicthash=NULL;
    int32  cilistsize=0, cdheapsize=0, threshold, tph_list_given, ncd;
    const char   *phnlist, *incimdef, *triphnlist, *incdmdef;
    const char   *lsnfile, *dictfn, *fillerdictfn;
    char **CIlist=NULL;
    const char   *cimdeffn, *alltphnmdeffn, *untiedmdeffn, *countfn;
    int32 ignore_wpos;

    parse_cmd_ln(argc,argv);

    /* Test all flags before beginning */
    cimdeffn = cmd_ln_str("-ocimdef");
    alltphnmdeffn = cmd_ln_str("-oalltphnmdef");
    untiedmdeffn = cmd_ln_str("-ountiedmdef");
    countfn = cmd_ln_str("-ocountfn");
    ignore_wpos = cmd_ln_int32("-ignorewpos");

    if (cimdeffn) E_INFO("Will write CI mdef file %s\n",cimdeffn);
    if (alltphnmdeffn) 
	E_INFO("Will write alltriphone mdef file %s\n",alltphnmdeffn);
    if (untiedmdeffn) E_INFO("Will write untied mdef file %s\n",untiedmdeffn);
    if (countfn) E_INFO("Will write triphone counts file %s\n",countfn);

    if (!cimdeffn && !alltphnmdeffn && !untiedmdeffn && !countfn)
	E_FATAL("No output mdef files or count files specified!\n");

    dictfn = cmd_ln_str("-dictfn");
    fillerdictfn = cmd_ln_str("-fdictfn");
    lsnfile = cmd_ln_str("-lsnfn");
    if ((untiedmdeffn || countfn) && (!lsnfile || !dictfn)) {
	E_WARN("Either dictionary or transcript file not given!\n"); 
  	if (untiedmdeffn) E_WARN("Untied mdef will not be made\n");
  	if (countfn) E_WARN("Phone counts will not be generated\n");
	untiedmdeffn = countfn = NULL;
    }

    phnlist = cmd_ln_str("-phnlstfn");
    triphnlist = cmd_ln_str("-triphnlstfn");
    incimdef = cmd_ln_str("-inCImdef");
    incdmdef = cmd_ln_str("-inCDmdef");
    if (!incdmdef && !incimdef && !phnlist && !triphnlist)
	E_FATAL("No input mdefs or phone list given\n");
    if (triphnlist) {
	if (phnlist) 
	    E_WARN("Both -triphnlist %s and -phnlist given.\n",triphnlist);
	    E_WARN("Ignoring -phnlist %s\n",phnlist);
        phnlist = triphnlist;
    }
    tph_list_given =  (triphnlist || incdmdef) ? 1 : 0;

    if (incdmdef) {
	if (incimdef || phnlist){
	    E_WARN("Using only input CD mdef %s!\n",incdmdef);
	    E_WARN("Using only triphones from input CD mdef %s!\n",incdmdef);
	    if (incimdef) E_WARN("CImdef %s will be ignored\n",incimdef);
	    if (phnlist) E_WARN("phonelist %s will be ignored\n",phnlist);
	    incimdef = phnlist = NULL; 
	}
	make_ci_list_cd_hash_frm_mdef(incdmdef,&CIlist,&cilistsize,
							   &CDhash,&ncd);
    }
    else{
        if (phnlist)
	    make_ci_list_cd_hash_frm_phnlist(phnlist,&CIlist,
						&cilistsize,&CDhash,&ncd);
	if (incimdef) {
	    if (CIlist) ckd_free_2d((void**)CIlist);
	    make_ci_list_frm_mdef(incimdef,&CIlist,&cilistsize);
        }
    }
    if (cimdeffn) 
	make_mdef_from_list(cimdeffn,CIlist,cilistsize,NULL,0,argv[0]);

    if (!tph_list_given && !cimdeffn) {
	read_dict(dictfn, fillerdictfn, &dicthash);
	if (CDhash) freehash(CDhash);
	make_dict_triphone_list (dicthash, &CDhash, ignore_wpos);
    }

    if (alltphnmdeffn){
	threshold = -1;
	make_CD_heap(CDhash,threshold,&CDheap,&cdheapsize);
    	make_mdef_from_list(alltphnmdeffn,CIlist,cilistsize,
					CDheap,cdheapsize,argv[0]);
    }
    if (countfn || untiedmdeffn) 
        count_triphones(lsnfile, dicthash, CDhash, &CIhash, ignore_wpos);
    if (countfn){
	print_counts(countfn,CIhash,CDhash);
    }
    if (untiedmdeffn){
        threshold = find_threshold(CDhash);
        make_CD_heap(CDhash,threshold,&CDheap,&cdheapsize);
        make_mdef_from_list(untiedmdeffn,CIlist,cilistsize,
			    CDheap,cdheapsize,argv[0]);
    }
    return 0;
}